

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_memory_array.h
# Opt level: O2

void __thiscall
SharedMemoryArray<unsigned_int>::SharedMemoryArray
          (SharedMemoryArray<unsigned_int> *this,size_t size)

{
  uint *__s;
  ContextManager *pCVar1;
  string local_40;
  
  this->size_ = size;
  __s = (uint *)allocate_shared_memory(size * 4);
  memset(__s,0,-(ulong)(size >> 0x3e != 0) | size * 4);
  this->ptr_ = __s;
  if (__s == (uint *)0xffffffffffffffff) {
    pCVar1 = ContextManager::get();
    format_abi_cxx11_(&local_40,"Cannot allocate %zu bytes of shared memory: %m",4);
    (**pCVar1->_vptr_ContextManager)(pCVar1,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

explicit SharedMemoryArray(size_t size) : size_(size) {
        ptr_ = static_cast<T *>(allocate_shared_memory(sizeof(T) * size));
        ptr_ = new(ptr_) T[size]();
        if (ptr_ == MAP_FAILED) {
            die(format("Cannot allocate %zu bytes of shared memory: %m", sizeof(T)));
        }
    }